

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmk.cpp
# Opt level: O0

bool ReadDMK(MemFile *file,shared_ptr<Disk> *disk)

{
  allocator<unsigned_short> *this;
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong extraout_RAX;
  ulong uVar6;
  exception *peVar7;
  string *psVar8;
  size_type __n;
  reference pvVar9;
  LogHelper *pLVar10;
  byte *pbVar11;
  reference t;
  element_type *peVar12;
  BitBuffer *__buf;
  char *pcVar13;
  mapped_type *this_00;
  size_t in_RCX;
  FILE *__stream;
  int local_334;
  Encoding local_32c;
  int local_2fc;
  int local_2c8;
  int local_2a0;
  byte local_23a;
  allocator<char> local_219;
  key_type local_218;
  CylHead local_1f4;
  ushort local_1ea;
  int local_1e8;
  Encoding EStack_1e4;
  value_type idam_entry;
  int rewind;
  Encoding am_encoding;
  int idam_distance;
  int max_distance;
  int min_distance;
  bool is_am;
  value_type b;
  undefined1 local_1c8 [8];
  BitstreamTrackBuilder bitbuf;
  bool found_dam;
  bool found_iam;
  int step;
  int fm_step;
  Encoding current_idam_encoding;
  Encoding next_idam_encoding;
  int next_idam_pos;
  int current_idam_pos;
  int last_pos;
  int pos;
  int idx_idam;
  unsigned_short *local_110;
  unsigned_short *local_108;
  unsigned_short *local_100;
  char *local_f8;
  allocator<unsigned_char> local_e9;
  undefined1 local_e8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_c8 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> index;
  int head;
  int cyl;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  int local_54;
  uint local_50;
  int total_size;
  int tracklen;
  int heads;
  uint8_t cyls;
  byte local_33;
  byte local_32;
  byte local_31;
  char local_30;
  byte local_2f;
  unsigned_short local_2e;
  byte local_2c;
  bool single_sided;
  bool single_density;
  bool ignore_density;
  DMK_HEADER dh;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  __stream = (FILE *)0x0;
  dh._8_8_ = disk;
  memset(&local_30,0,0x10);
  MemFile::rewind(file,__stream);
  if (((extraout_RAX & 1) == 0) ||
     (uVar6 = MemFile::read(file,(int)&local_30,(void *)0x10,in_RCX), (uVar6 & 1) == 0)) {
    file_local._7_1_ = false;
  }
  else if ((local_30 == '\0') || (local_30 == -1)) {
    local_31 = (local_2c & 0x80) != 0;
    local_32 = (local_2c & 0x40) != 0;
    local_33 = (local_2c & 0x10) != 0;
    uVar3 = util::letoh<unsigned_int>(dh._4_4_);
    if (uVar3 == 0x12345678) {
      peVar7 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[51]>
                (peVar7,(char (*) [51])"DMK real-disk-specification images contain no data");
      __cxa_throw(peVar7,&util::exception::typeinfo,util::exception::~exception);
    }
    tracklen._3_1_ = local_2f;
    total_size = 2;
    if ((local_33 & 1) != 0) {
      total_size = 1;
    }
    uVar2 = util::letoh<unsigned_short>(local_2e);
    local_50 = (uint)uVar2;
    if (((tracklen._3_1_ == 0) || (local_50 == 0)) || (0x3fff < local_50)) {
      file_local._7_1_ = false;
    }
    else {
      local_54 = local_50 * tracklen._3_1_ * total_size + 0x10;
      iVar4 = MemFile::size(file);
      if (iVar4 != local_54) {
        psVar8 = MemFile::name_abi_cxx11_(file);
        std::allocator<char>::allocator();
        cyl._2_1_ = 0;
        cyl._1_1_ = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"dmk",&local_79);
        bVar1 = IsFileExt(psVar8,&local_78);
        local_23a = 0;
        if (!bVar1) {
          psVar8 = MemFile::name_abi_cxx11_(file);
          std::allocator<char>::allocator();
          cyl._2_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"dsk",(allocator<char> *)((long)&cyl + 3));
          cyl._1_1_ = 1;
          bVar1 = IsFileExt(psVar8,&local_a0);
          local_23a = bVar1 ^ 0xff;
        }
        if ((cyl._1_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_a0);
        }
        if ((cyl._2_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&cyl + 3));
        }
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
        if ((local_23a & 1) != 0) {
          return false;
        }
        head = MemFile::size(file);
        Message<int,int&>(msgWarning,"DMK size (%d) doesn\'t match calculated size (%d)",&head,
                          &local_54);
      }
      if ((local_31 & 1) != 0) {
        peVar7 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[51]>
                  (peVar7,(char (*) [51])"DMK ignore density flag is not currently supported");
        __cxa_throw(peVar7,&util::exception::typeinfo,util::exception::~exception);
      }
      local_50 = local_50 - 0x80;
      for (index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < (int)(uint)tracklen._3_1_;
          index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        for (index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            (int)index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < total_size;
            index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
          this = (allocator<unsigned_short> *)
                 ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<unsigned_short>::allocator(this);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8,0x40,this);
          std::allocator<unsigned_short>::~allocator
                    ((allocator<unsigned_short> *)
                     ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          __n = (size_type)(int)local_50;
          std::allocator<unsigned_char>::allocator(&local_e9);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,__n,&local_e9
                    );
          std::allocator<unsigned_char>::~allocator(&local_e9);
          bVar1 = MemFile::read<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                            (file,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  local_c8);
          if ((!bVar1) ||
             (bVar1 = MemFile::read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                (file,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_e8), !bVar1)) {
            local_f8 = CH(index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (int)index.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
            Message<char_const*>(msgWarning,"short file reading %s",&local_f8);
          }
          local_100 = (unsigned_short *)
                      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8
                                );
          local_108 = (unsigned_short *)
                      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8
                                );
          local_110 = (unsigned_short *)
                      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8
                                );
          _pos = std::
                 transform<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,ReadDMK(MemFile&,std::shared_ptr<Disk>&)::__0>
                           (local_100,local_108,local_110);
          last_pos = 0;
          current_idam_pos = 0;
          next_idam_pos = 0;
          next_idam_encoding = Unknown;
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8,0)
          ;
          current_idam_encoding = (*pvVar9 & 0x3fff) - 0x80;
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8,0)
          ;
          bVar1 = true;
          if (*pvVar9 != 0) {
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8,
                                0);
            bVar1 = (*pvVar9 & 0x8000) != 0;
          }
          step = FM;
          if (bVar1) {
            step = MFM;
          }
          uVar6 = 1;
          iVar4 = 2;
          if ((local_32 & 1) != 0) {
            iVar4 = 1;
          }
          local_2a0 = iVar4;
          if (step == MFM) {
            local_2a0 = 1;
          }
          bitbuf.m_buffer._100_4_ = local_2a0;
          bitbuf.m_buffer._99_1_ = 0;
          bitbuf.m_buffer._98_1_ = 0;
          fm_step = step;
          BitstreamTrackBuilder::BitstreamTrackBuilder
                    ((BitstreamTrackBuilder *)local_1c8,_250K,step);
          if (opt.debug != 0) {
            pLVar10 = util::operator<<((LogHelper *)&util::cout,(char (*) [6])"DMK: ");
            CylHead::CylHead((CylHead *)&min_distance,
                             index.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (int)index.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pLVar10 = util::operator<<(pLVar10,(CylHead *)&min_distance);
            util::operator<<(pLVar10,(char (*) [2])0x2a74b6);
          }
          while (current_idam_pos < (int)local_50) {
            pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                                 (long)current_idam_pos);
            max_distance._3_1_ = *pbVar11;
            max_distance._2_1_ = '\0';
            if (((int)current_idam_encoding < 1) || (current_idam_pos < (int)current_idam_encoding))
            {
              if (((bitbuf.m_buffer._99_1_ & 1) == 0) &&
                 ((max_distance._3_1_ == 0xfc && (next_idam_encoding == Unknown)))) {
                if (opt.debug != 0) {
                  pLVar10 = util::operator<<((LogHelper *)&util::cout,(Encoding *)&fm_step);
                  pLVar10 = util::operator<<(pLVar10,(char (*) [16])" IAM at offset ");
                  pLVar10 = util::operator<<(pLVar10,&current_idam_pos);
                  util::operator<<(pLVar10,(char (*) [2])0x2a74b6);
                }
                bitbuf.m_buffer._99_1_ = 1;
                max_distance._2_1_ = '\x01';
              }
              else if (((bitbuf.m_buffer._98_1_ & 1) == 0) &&
                      ((0xf7 < max_distance._3_1_ && (max_distance._3_1_ < 0xfe)))) {
                iVar5 = 7;
                if (step == 1) {
                  iVar5 = 0xe;
                }
                idam_distance = iVar5 * bitbuf.m_buffer._100_4_;
                iVar5 = 0x1e;
                if (step == 1) {
                  iVar5 = 0x2b;
                }
                uVar6 = (ulong)(uint)(iVar5 * bitbuf.m_buffer._100_4_);
                am_encoding = idam_distance + iVar5 * bitbuf.m_buffer._100_4_;
                if (next_idam_encoding == Unknown) {
                  local_2fc = 0;
                }
                else {
                  local_2fc = current_idam_pos - next_idam_encoding;
                }
                rewind = local_2fc;
                if ((idam_distance <= local_2fc) && (local_2fc <= (int)am_encoding)) {
                  if (opt.debug != 0) {
                    pLVar10 = util::operator<<((LogHelper *)&util::cout,(Encoding *)&step);
                    pLVar10 = util::operator<<(pLVar10,(char (*) [7])" DAM (");
                    pLVar10 = util::operator<<(pLVar10,(uchar *)((long)&max_distance + 3));
                    pLVar10 = util::operator<<(pLVar10,(char (*) [13])") at offset ");
                    pLVar10 = util::operator<<(pLVar10,&current_idam_pos);
                    util::operator<<(pLVar10,(char (*) [2])0x2a74b6);
                  }
                  bitbuf.m_buffer._98_1_ = 1;
                  max_distance._2_1_ = '\x01';
                }
              }
            }
            else {
              current_idam_pos = current_idam_encoding;
              pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8
                                   ,(long)(int)current_idam_encoding);
              max_distance._3_1_ = *pbVar11;
              if (opt.debug != 0) {
                pLVar10 = util::operator<<((LogHelper *)&util::cout,(Encoding *)&fm_step);
                pLVar10 = util::operator<<(pLVar10,(char (*) [8])" IDAM (");
                local_2c8 = iVar4;
                if (fm_step == 1) {
                  local_2c8 = 1;
                }
                uVar6 = (ulong)(uint)(local_2c8 * 3);
                t = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                               (long)(current_idam_pos + local_2c8 * 3));
                pLVar10 = util::operator<<(pLVar10,t);
                pLVar10 = util::operator<<(pLVar10,(char (*) [13])") at offset ");
                pLVar10 = util::operator<<(pLVar10,&current_idam_pos);
                util::operator<<(pLVar10,(char (*) [2])0x2a74b6);
              }
              if (max_distance._3_1_ != 0xfe) {
                __assert_fail("b == IBM_IDAM",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dmk.cpp"
                              ,0x6f,"bool ReadDMK(MemFile &, std::shared_ptr<Disk> &)");
              }
              max_distance._2_1_ = '\x01';
            }
            if (max_distance._2_1_ == '\0') {
              current_idam_pos = bitbuf.m_buffer._100_4_ + current_idam_pos;
            }
            else {
              if (max_distance._3_1_ == 0xfe) {
                local_32c = fm_step;
              }
              else {
                local_32c = BitstreamTrackBuilder::encoding((BitstreamTrackBuilder *)local_1c8);
              }
              EStack_1e4 = local_32c;
              local_1e8 = 0xc;
              if (local_32c == MFM) {
                local_1e8 = 0xb;
              }
              for (; next_idam_pos < current_idam_pos - local_1e8;
                  next_idam_pos = bitbuf.m_buffer._100_4_ + next_idam_pos) {
                pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_e8,(long)next_idam_pos);
                TrackBuilder::addByte((TrackBuilder *)local_1c8,(uint)*pbVar11);
              }
              BitstreamTrackBuilder::setEncoding((BitstreamTrackBuilder *)local_1c8,EStack_1e4);
              bVar1 = EStack_1e4 == MFM;
              uVar6 = (ulong)bVar1;
              TrackBuilder::addBlock((TrackBuilder *)local_1c8,0,bVar1 + 6 + (uint)bVar1);
              TrackBuilder::addAM((TrackBuilder *)local_1c8,(uint)max_distance._3_1_,true);
              local_334 = iVar4;
              if (EStack_1e4 == MFM) {
                local_334 = 1;
              }
              bitbuf.m_buffer._100_4_ = local_334;
              next_idam_pos = local_334 + current_idam_pos;
              current_idam_pos = next_idam_pos;
              if (max_distance._3_1_ == 0xfe) {
                next_idam_encoding = current_idam_encoding;
                step = fm_step;
                bitbuf.m_buffer._98_1_ = 0;
                last_pos = last_pos + 1;
                pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                    local_c8,(long)last_pos);
                local_1ea = *pvVar9;
                current_idam_encoding = (local_1ea & 0x3fff) - 0x80;
                uVar6 = 1;
                fm_step = 2;
                if (local_1ea == 0 || (local_1ea & 0x8000) != 0) {
                  fm_step = 1;
                }
              }
              else if ((EStack_1e4 == FM) && (max_distance._3_1_ == 0xfd)) {
                BitstreamTrackBuilder::setEncoding((BitstreamTrackBuilder *)local_1c8,MFM);
                bitbuf.m_buffer._100_4_ = 1;
              }
            }
          }
          for (; next_idam_pos < current_idam_pos;
              next_idam_pos = bitbuf.m_buffer._100_4_ + next_idam_pos) {
            pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                                 (long)next_idam_pos);
            TrackBuilder::addByte((TrackBuilder *)local_1c8,(uint)*pbVar11);
          }
          peVar12 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)dh._8_8_);
          CylHead::CylHead(&local_1f4,
                           index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           (int)index.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          __buf = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_1c8);
          Disk::write(peVar12,(int)&local_1f4,__buf,uVar6);
          BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_1c8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c8);
        }
      }
      pcVar13 = "read-write";
      if (local_30 != '\0') {
        pcVar13 = "read-only";
      }
      peVar12 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           dh._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"protect",&local_219);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar12->metadata,&local_218);
      std::__cxx11::string::operator=((string *)this_00,pcVar13);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      peVar12 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           dh._8_8_);
      std::__cxx11::string::operator=((string *)&peVar12->strType,"DMK");
      file_local._7_1_ = true;
    }
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool ReadDMK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    DMK_HEADER dh{};
    if (!file.rewind() || !file.read(&dh, sizeof(dh)))
        return false;
    else if ((dh.protect != 0x00 && dh.protect != 0xff))
        return false;

    bool ignore_density = (dh.flags & 0x80) != 0;
    bool single_density = (dh.flags & 0x40) != 0;
    bool single_sided = (dh.flags & 0x10) != 0;

    if (util::letoh(dh.realsig) == 0x12345678)
        throw util::exception("DMK real-disk-specification images contain no data");

    auto cyls = dh.cyls;
    auto heads = single_sided ? 1 : 2;
    int tracklen = util::letoh(dh.tracklen);
    if (!cyls || !tracklen || tracklen > DMK_MAX_TRACK_LENGTH)
        return false;

    auto total_size = static_cast<int>(sizeof(DMK_HEADER) + tracklen * cyls * heads);
    if (file.size() != total_size)
    {
        // Accept wrong size only if the extension is recognised.
        if (!IsFileExt(file.name(), "dmk") && !IsFileExt(file.name(), "dsk"))
            return false;

        Message(msgWarning, "DMK size (%d) doesn't match calculated size (%d)",
            file.size(), total_size);
    }

    if (ignore_density)
        throw util::exception("DMK ignore density flag is not currently supported");

    tracklen -= DMK_TRACK_INDEX_SIZE;

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            std::vector<uint16_t> index(64);
            std::vector<uint8_t> data(tracklen);

            if (!file.read(index) || !file.read(data))
                Message(msgWarning, "short file reading %s", CH(cyl, head));

            std::transform(index.begin(), index.end(), index.begin(),
                [](uint16_t w) { return util::letoh(w); });

            int idx_idam = 0;
            int pos = 0;
            int last_pos = pos;

            int current_idam_pos = 0;
            int next_idam_pos = (index[0] & 0x3fff) - DMK_TRACK_INDEX_SIZE;

            auto next_idam_encoding =
                (!index[0] || (index[0] & 0x8000)) ? Encoding::MFM : Encoding::FM;
            auto current_idam_encoding = next_idam_encoding;

            int fm_step = single_density ? 1 : 2;
            int step = (current_idam_encoding == Encoding::MFM) ? 1 : fm_step;

            bool found_iam = false;
            bool found_dam = false;

            BitstreamTrackBuilder bitbuf(DataRate::_250K, current_idam_encoding);
            if (opt.debug)
                util::cout << "DMK: " << CylHead(cyl, head) << "\n";

            while (pos < tracklen)
            {
                auto b = data[pos];
                bool is_am = false;

                if (next_idam_pos > 0 && pos >= next_idam_pos)
                {
                    // Force sync in case of odd/even mismatch.
                    pos = next_idam_pos;
                    b = data[pos];

                    if (opt.debug)
                    {
                        util::cout << next_idam_encoding << " IDAM (" <<
                            data[pos + 3 * ((next_idam_encoding == Encoding::MFM) ? 1 : fm_step)] <<
                            ") at offset " << pos << "\n";
                    }

                    assert(b == IBM_IDAM);
                    is_am = true;
                }
                else if (!found_iam && b == IBM_IAM && current_idam_pos == 0)
                {
                    if (opt.debug)
                        util::cout << next_idam_encoding << " IAM at offset " << pos << "\n";

                    is_am = found_iam = true;
                }
                else if (!found_dam && b >= 0xf8 && b <= 0xfd)
                {
                    auto min_distance = ((current_idam_encoding == Encoding::MFM) ? 14 : 7) * step;
                    auto max_distance = min_distance + ((current_idam_encoding == Encoding::MFM) ? 43 : 30) * step;
                    auto idam_distance = current_idam_pos ? (pos - current_idam_pos) : 0;

                    if (idam_distance >= min_distance && idam_distance <= max_distance)
                    {
                        if (opt.debug)
                            util::cout << current_idam_encoding << " DAM (" << b << ") at offset " << pos << "\n";

                        is_am = found_dam = true;
                    }
                }

                if (is_am)
                {
                    auto am_encoding = (b == IBM_IDAM) ? next_idam_encoding : bitbuf.encoding();
                    int rewind = (am_encoding == Encoding::MFM) ? (8 + 3) : (6 * 2);

                    while (last_pos < (pos - rewind))
                    {
                        bitbuf.addByte(data[last_pos]);
                        last_pos += step;
                    }

                    // Rewrite minimal sync and the address mark with missing clock bits
                    bitbuf.setEncoding(am_encoding);
                    bitbuf.addBlock(0x00, (am_encoding == Encoding::MFM) ? 8 : 6);
                    bitbuf.addAM(b, true);

                    step = (am_encoding == Encoding::MFM) ? 1 : fm_step;
                    pos += step;
                    last_pos = pos;

                    if (b == IBM_IDAM)
                    {
                        current_idam_pos = next_idam_pos;
                        current_idam_encoding = next_idam_encoding;
                        found_dam = false;

                        auto idam_entry = index[++idx_idam];
                        next_idam_pos = (idam_entry & 0x3fff) - 0x80;
                        next_idam_encoding = (!idam_entry || (idam_entry & 0x8000)) ? Encoding::MFM : Encoding::FM;
                    }
                    else if (am_encoding == Encoding::FM && b == IBM_DAM_RX02)
                    {
                        bitbuf.setEncoding(Encoding::MFM);
                        step = 1;
                    }

                    continue;
                }

                pos += step;
            }

            while (last_pos < pos)
            {
                bitbuf.addByte(data[last_pos]);
                last_pos += step;
            }

            disk->write(CylHead(cyl, head), std::move(bitbuf.buffer()));
        }
    }

    disk->metadata["protect"] = dh.protect ? "read-only" : "read-write";

    disk->strType = "DMK";
    return true;
}